

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O2

SMBusByte * __thiscall SMBusByte::ToAddrFrame(SMBusByte *this,SMBusProtocol *pProt)

{
  byte bVar1;
  undefined8 uVar2;
  pointer in_RDX;
  
  Frame::Frame((Frame *)this);
  this[1].value = '\b';
  uVar2 = **(undefined8 **)pProt->prot_elems;
  this->value = (char)uVar2;
  this->is_acked = (bool)(char)((ulong)uVar2 >> 8);
  *(int6 *)&this->field_0x2 = (int6)((ulong)uVar2 >> 0x10);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)(*(long *)(pProt->prot_elems + 2) + -0x20);
  bVar1 = *(byte *)&pProt->name;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(ulong)(bVar1 >> 1);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_RDX;
  this[1].is_acked = (bool)(bVar1 * '\x02' & 2 | *(byte *)((long)&pProt->name + 1));
  return this;
}

Assistant:

Frame SMBusByte::ToAddrFrame( const SMBusProtocol* pProt ) const
{
    Frame f;

    f.mType = FT_Address;
    f.mStartingSampleInclusive = signals.front().sample_begin;
    f.mEndingSampleInclusive = signals.back().sample_end;
    f.mData1 = value >> 1;
    f.mData2 = U64( pProt );
    f.mFlags = 0;
    if( is_acked )
        f.mFlags |= F_IsAcked;

    if( value & 1 )
        f.mFlags |= F_IsRead;

    return f;
}